

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

string * __thiscall OpenMD::StringTokenizer::getRemainingString_abi_cxx11_(StringTokenizer *this)

{
  bool bVar1;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  long in_RSI;
  string *in_RDI;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  insertIter;
  const_iterator tmpIter;
  string *result;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  string *this_01;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [3];
  char *local_38;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  local_20 = *(undefined8 *)(in_RSI + 0x48);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_ffffffffffffff78);
  if (bVar1) {
    local_38 = (char *)std::__cxx11::string::begin();
    std::
    insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::insert_iterator(&local_30,in_RDI,(_Iter)local_38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      in_stack_ffffffffffffff84 = 0;
      local_50[0] = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator++(in_stack_ffffffffffffff88,0);
      in_stack_ffffffffffffff88 =
           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)__gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(local_50);
      this_00 = std::
                insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_30,in_stack_ffffffffffffff84);
      in_stack_ffffffffffffff78 =
           std::
           insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(this_00);
      std::
      insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=((insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_01,(value_type *)in_RDI);
    }
  }
  return this_01;
}

Assistant:

std::string StringTokenizer::getRemainingString() const {
    std::string result;
    std::string::const_iterator tmpIter = currentPos_;
    if (tmpIter != end_) {
      std::insert_iterator<std::string> insertIter(result, result.begin());

      while (tmpIter != end_) {
        *insertIter++ = *tmpIter++;
      }
    }

    return result;
  }